

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O1

void embree::sse42::
     BVHNIntersectorKHybrid<4,_4,_16777232,_true,_embree::sse42::ArrayIntersectorK_1<4,_embree::sse42::TriangleMiMBIntersectorKPluecker<4,_4,_true>_>,_true>
     ::intersect1(Intersectors *This,BVH *bvh,NodeRef root,size_t k,Precalculations *pre,
                 RayHitK<4> *ray,TravRayK<4,_true> *tray,RayQueryContext *context)

{
  float *pfVar1;
  float *pfVar2;
  float *pfVar3;
  float *pfVar4;
  float *pfVar5;
  float *pfVar6;
  float *pfVar7;
  float *pfVar8;
  float *pfVar9;
  float *pfVar10;
  float *pfVar11;
  undefined8 *puVar12;
  float *pfVar13;
  float *pfVar14;
  float *pfVar15;
  float *pfVar16;
  undefined4 *puVar17;
  float *pfVar18;
  float *pfVar19;
  undefined4 *puVar20;
  float *pfVar21;
  float *pfVar22;
  float *pfVar23;
  float *pfVar24;
  undefined4 uVar25;
  int iVar26;
  undefined4 uVar27;
  undefined8 uVar28;
  Scene *pSVar29;
  Geometry *pGVar30;
  long lVar31;
  long lVar32;
  bool bVar33;
  bool bVar34;
  bool bVar35;
  bool bVar36;
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined8 uVar41;
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  StackItemT<embree::NodeRefPtr<4>_> *pSVar45;
  int iVar46;
  AABBNodeMB4D *node1;
  ulong uVar47;
  long lVar48;
  ulong uVar49;
  RTCRayN *pRVar50;
  ulong uVar51;
  float *vertices;
  ulong uVar52;
  ulong uVar53;
  ulong uVar54;
  ulong uVar55;
  undefined4 uVar56;
  ulong uVar58;
  ulong uVar59;
  ulong uVar60;
  ulong uVar61;
  ulong uVar62;
  uint uVar63;
  uint uVar64;
  uint uVar65;
  uint uVar66;
  float fVar67;
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  anon_union_16_2_9473010e_for_vboolf_impl<4>_1 aVar85;
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  float fVar94;
  float fVar95;
  float fVar103;
  float fVar104;
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  StackItemT<embree::NodeRefPtr<4>_> SVar98;
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar105 [16];
  StackItemT<embree::NodeRefPtr<4>_> SVar106;
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  float fVar112;
  float fVar113;
  float fVar121;
  float fVar123;
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  StackItemT<embree::NodeRefPtr<4>_> SVar118;
  float fVar122;
  float fVar124;
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  float fVar125;
  float fVar126;
  float fVar127;
  float fVar128;
  float fVar131;
  float fVar132;
  float fVar133;
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  float fVar134;
  float fVar135;
  float fVar138;
  float fVar139;
  undefined1 auVar136 [16];
  float fVar140;
  undefined1 auVar137 [16];
  float fVar141;
  float fVar142;
  float fVar143;
  float fVar144;
  float fVar145;
  float fVar146;
  float fVar147;
  float fVar148;
  float fVar149;
  undefined1 auVar150 [16];
  float fVar151;
  float fVar153;
  float fVar154;
  float fVar155;
  undefined1 auVar152 [16];
  float fVar156;
  float fVar157;
  float fVar159;
  float fVar160;
  float fVar161;
  float fVar162;
  float fVar163;
  float fVar164;
  undefined1 auVar158 [16];
  float fVar165;
  float fVar166;
  float fVar169;
  float fVar170;
  float fVar171;
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  float fVar172;
  float fVar173;
  float fVar175;
  float fVar176;
  float fVar177;
  float fVar178;
  float fVar179;
  float fVar180;
  undefined1 auVar174 [16];
  UVIdentity<4> mapUV;
  StackItemT<embree::NodeRefPtr<4>_> *local_1308;
  float local_12e8;
  float fStack_12e4;
  float fStack_12e0;
  float fStack_12dc;
  float fStack_12d0;
  float fStack_12cc;
  undefined8 local_12c8;
  vbool<4> valid;
  float fStack_1290;
  float fStack_128c;
  undefined8 local_1288;
  float fStack_1270;
  float fStack_126c;
  int local_1268;
  int iStack_1264;
  undefined8 uStack_1260;
  undefined8 *local_1258;
  ulong local_1250;
  ulong local_1248;
  ulong local_1240;
  ulong local_1238;
  long local_1230;
  Scene *scene;
  long local_1220;
  RTCFilterFunctionNArguments args;
  undefined8 local_11c8;
  undefined8 uStack_11c0;
  vfloat<4> tNear;
  undefined1 local_1168 [16];
  undefined1 local_1158 [16];
  float local_1148 [4];
  undefined1 local_1138 [16];
  undefined1 local_1128 [16];
  undefined1 local_1118 [16];
  float local_1108;
  float fStack_1104;
  float fStack_1100;
  float fStack_10fc;
  float local_10f8;
  float fStack_10f4;
  float fStack_10f0;
  float fStack_10ec;
  float local_10e8;
  float fStack_10e4;
  float fStack_10e0;
  float fStack_10dc;
  float local_10d8;
  float fStack_10d4;
  float fStack_10d0;
  float fStack_10cc;
  float local_10c8;
  float fStack_10c4;
  float fStack_10c0;
  float fStack_10bc;
  float local_10b8;
  float fStack_10b4;
  float fStack_10b0;
  float fStack_10ac;
  float local_10a8;
  float fStack_10a4;
  float fStack_10a0;
  float fStack_109c;
  float local_1098;
  float fStack_1094;
  float fStack_1090;
  float fStack_108c;
  float local_1088;
  float fStack_1084;
  float fStack_1080;
  float fStack_107c;
  undefined1 local_1078 [16];
  undefined1 local_1068 [16];
  float local_1058;
  float fStack_1054;
  float fStack_1050;
  float fStack_104c;
  float local_1048;
  float fStack_1044;
  float fStack_1040;
  float fStack_103c;
  float local_1038;
  float fStack_1034;
  float fStack_1030;
  float fStack_102c;
  float local_1028;
  float fStack_1024;
  float fStack_1020;
  float fStack_101c;
  undefined8 local_1018;
  undefined8 uStack_1010;
  RTCHitN local_1008 [16];
  undefined1 local_ff8 [16];
  undefined4 local_fe8;
  undefined4 uStack_fe4;
  undefined4 uStack_fe0;
  undefined4 uStack_fdc;
  undefined4 local_fd8;
  undefined4 uStack_fd4;
  undefined4 uStack_fd0;
  undefined4 uStack_fcc;
  float local_fc8;
  float fStack_fc4;
  float fStack_fc0;
  float fStack_fbc;
  undefined1 local_fb8 [16];
  undefined1 local_fa8 [16];
  uint local_f98;
  uint uStack_f94;
  uint uStack_f90;
  uint uStack_f8c;
  uint local_f88;
  uint uStack_f84;
  uint uStack_f80;
  uint uStack_f7c;
  StackItemT<embree::NodeRefPtr<4>_> stack [244];
  RayHitK<4> *pRVar57;
  
  local_1308 = stack + 1;
  stack[0].ptr.ptr = root.ptr;
  stack[0].dist = 0;
  local_1098 = *(float *)((long)&(tray->org).field_0 + k * 4);
  local_10a8 = *(float *)((long)&(tray->org).field_0 + k * 4 + 0x10);
  local_10b8 = *(float *)((long)&(tray->org).field_0 + k * 4 + 0x20);
  local_10c8 = *(float *)((long)&(tray->rdir).field_0 + k * 4);
  local_10d8 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x10);
  local_10e8 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x20);
  local_1108 = local_10c8 * 0.99999964;
  fVar125 = local_10d8 * 0.99999964;
  local_10f8 = local_10e8 * 0.99999964;
  local_10c8 = local_10c8 * 1.0000004;
  local_10d8 = local_10d8 * 1.0000004;
  local_10e8 = local_10e8 * 1.0000004;
  local_1238 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4);
  local_1240 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x10);
  local_1248 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x20);
  local_1250 = local_1238 ^ 0x10;
  uVar52 = local_1240 ^ 0x10;
  uVar53 = local_1248 ^ 0x10;
  iVar46 = (tray->tnear).field_0.i[k];
  auVar136._4_4_ = iVar46;
  auVar136._0_4_ = iVar46;
  auVar136._8_4_ = iVar46;
  auVar136._12_4_ = iVar46;
  iVar46 = (tray->tfar).field_0.i[k];
  auVar87._4_4_ = iVar46;
  auVar87._0_4_ = iVar46;
  auVar87._8_4_ = iVar46;
  auVar87._12_4_ = iVar46;
  local_1258 = (undefined8 *)(mm_lookupmask_ps + (long)(1 << ((byte)k & 0x1f)) * 0x10);
  fStack_1094 = local_1098;
  fStack_1090 = local_1098;
  fStack_108c = local_1098;
  fStack_10a4 = local_10a8;
  fStack_10a0 = local_10a8;
  fStack_109c = local_10a8;
  fStack_10b4 = local_10b8;
  fStack_10b0 = local_10b8;
  fStack_10ac = local_10b8;
  fStack_10c4 = local_10c8;
  fStack_10c0 = local_10c8;
  fStack_10bc = local_10c8;
  fStack_10d4 = local_10d8;
  fStack_10d0 = local_10d8;
  fStack_10cc = local_10d8;
  fStack_10e4 = local_10e8;
  fStack_10e0 = local_10e8;
  fStack_10dc = local_10e8;
  fStack_10f4 = local_10f8;
  fStack_10f0 = local_10f8;
  fStack_10ec = local_10f8;
  fStack_1104 = local_1108;
  fStack_1100 = local_1108;
  fStack_10fc = local_1108;
  uVar49 = local_1250;
  pRVar57 = ray;
  uVar55 = local_1238;
  uVar58 = local_1240;
  uVar59 = local_1248;
  fVar67 = local_1098;
  fVar94 = local_1098;
  fVar126 = local_1098;
  fVar171 = local_1098;
  fVar165 = local_10a8;
  fVar95 = local_10a8;
  fVar103 = local_10a8;
  fVar104 = local_10a8;
  fVar112 = local_10d8;
  fVar113 = local_10d8;
  fVar121 = local_10d8;
  fVar122 = local_10d8;
  fVar123 = local_10b8;
  fVar124 = local_10b8;
  fVar127 = local_10b8;
  fVar128 = local_10b8;
  fVar131 = local_10c8;
  fVar132 = local_10c8;
  fVar133 = local_10c8;
  fVar134 = local_10c8;
  fVar135 = local_10e8;
  fVar138 = local_10e8;
  fVar139 = local_10e8;
  fVar140 = local_10e8;
  fVar141 = local_10f8;
  fVar142 = local_10f8;
  fVar143 = local_10f8;
  fVar144 = local_10f8;
  fVar145 = local_1108;
  fVar146 = local_1108;
  fVar147 = local_1108;
  fVar148 = local_1108;
  do {
    do {
      do {
        if (local_1308 == stack) {
          return;
        }
        pSVar45 = local_1308 + -1;
        local_1308 = local_1308 + -1;
      } while (*(float *)(ray + k * 4 + 0x80) <= (float)pSVar45->dist &&
               (float)pSVar45->dist != *(float *)(ray + k * 4 + 0x80));
      uVar51 = (local_1308->ptr).ptr;
      do {
        if ((uVar51 & 8) == 0) {
          uVar47 = uVar51 & 0xfffffffffffffff0;
          fVar149 = *(float *)(ray + k * 4 + 0x70);
          pfVar22 = (float *)(uVar47 + 0x80 + uVar55);
          pfVar9 = (float *)(uVar47 + 0x20 + uVar55);
          auVar96._0_4_ = ((*pfVar22 * fVar149 + *pfVar9) - fVar67) * fVar145;
          auVar96._4_4_ = ((pfVar22[1] * fVar149 + pfVar9[1]) - fVar94) * fVar146;
          auVar96._8_4_ = ((pfVar22[2] * fVar149 + pfVar9[2]) - fVar126) * fVar147;
          auVar96._12_4_ = ((pfVar22[3] * fVar149 + pfVar9[3]) - fVar171) * fVar148;
          pfVar22 = (float *)(uVar47 + 0x80 + uVar58);
          pfVar9 = (float *)(uVar47 + 0x20 + uVar58);
          auVar96 = maxps(auVar136,auVar96);
          auVar117._0_4_ = ((*pfVar22 * fVar149 + *pfVar9) - fVar165) * fVar125;
          auVar117._4_4_ = ((pfVar22[1] * fVar149 + pfVar9[1]) - fVar95) * fVar125;
          auVar117._8_4_ = ((pfVar22[2] * fVar149 + pfVar9[2]) - fVar103) * fVar125;
          auVar117._12_4_ = ((pfVar22[3] * fVar149 + pfVar9[3]) - fVar104) * fVar125;
          pfVar22 = (float *)(uVar47 + 0x80 + uVar59);
          pfVar9 = (float *)(uVar47 + 0x20 + uVar59);
          auVar109._0_4_ = ((*pfVar22 * fVar149 + *pfVar9) - fVar123) * fVar141;
          auVar109._4_4_ = ((pfVar22[1] * fVar149 + pfVar9[1]) - fVar124) * fVar142;
          auVar109._8_4_ = ((pfVar22[2] * fVar149 + pfVar9[2]) - fVar127) * fVar143;
          auVar109._12_4_ = ((pfVar22[3] * fVar149 + pfVar9[3]) - fVar128) * fVar144;
          auVar109 = maxps(auVar117,auVar109);
          tNear.field_0 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)maxps(auVar96,auVar109);
          pfVar23 = (float *)(uVar47 + 0x80 + uVar49);
          pfVar9 = (float *)(uVar47 + 0x20 + uVar49);
          pfVar24 = (float *)(uVar47 + 0x80 + uVar52);
          pfVar22 = (float *)(uVar47 + 0x20 + uVar52);
          auVar130._0_4_ = ((*pfVar23 * fVar149 + *pfVar9) - fVar67) * fVar131;
          auVar130._4_4_ = ((pfVar23[1] * fVar149 + pfVar9[1]) - fVar94) * fVar132;
          auVar130._8_4_ = ((pfVar23[2] * fVar149 + pfVar9[2]) - fVar126) * fVar133;
          auVar130._12_4_ = ((pfVar23[3] * fVar149 + pfVar9[3]) - fVar171) * fVar134;
          auVar114._0_4_ = ((*pfVar24 * fVar149 + *pfVar22) - fVar165) * fVar112;
          auVar114._4_4_ = ((pfVar24[1] * fVar149 + pfVar22[1]) - fVar95) * fVar113;
          auVar114._8_4_ = ((pfVar24[2] * fVar149 + pfVar22[2]) - fVar103) * fVar121;
          auVar114._12_4_ = ((pfVar24[3] * fVar149 + pfVar22[3]) - fVar104) * fVar122;
          pfVar22 = (float *)(uVar47 + 0x80 + uVar53);
          pfVar9 = (float *)(uVar47 + 0x20 + uVar53);
          auVar116._0_4_ = ((*pfVar22 * fVar149 + *pfVar9) - fVar123) * fVar135;
          auVar116._4_4_ = ((pfVar22[1] * fVar149 + pfVar9[1]) - fVar124) * fVar138;
          auVar116._8_4_ = ((pfVar22[2] * fVar149 + pfVar9[2]) - fVar127) * fVar139;
          auVar116._12_4_ = ((pfVar22[3] * fVar149 + pfVar9[3]) - fVar128) * fVar140;
          auVar109 = minps(auVar114,auVar116);
          auVar96 = minps(auVar87,auVar130);
          auVar96 = minps(auVar96,auVar109);
          if (((uint)uVar51 & 7) == 6) {
            bVar33 = (fVar149 < *(float *)(uVar47 + 0xf0) && *(float *)(uVar47 + 0xe0) <= fVar149)
                     && tNear.field_0._0_4_ <= auVar96._0_4_;
            bVar34 = (fVar149 < *(float *)(uVar47 + 0xf4) && *(float *)(uVar47 + 0xe4) <= fVar149)
                     && tNear.field_0._4_4_ <= auVar96._4_4_;
            bVar35 = (fVar149 < *(float *)(uVar47 + 0xf8) && *(float *)(uVar47 + 0xe8) <= fVar149)
                     && tNear.field_0._8_4_ <= auVar96._8_4_;
            bVar36 = (fVar149 < *(float *)(uVar47 + 0xfc) && *(float *)(uVar47 + 0xec) <= fVar149)
                     && tNear.field_0._12_4_ <= auVar96._12_4_;
          }
          else {
            bVar33 = tNear.field_0._0_4_ <= auVar96._0_4_;
            bVar34 = tNear.field_0._4_4_ <= auVar96._4_4_;
            bVar35 = tNear.field_0._8_4_ <= auVar96._8_4_;
            bVar36 = tNear.field_0._12_4_ <= auVar96._12_4_;
          }
          auVar68._0_4_ = (uint)bVar33 * -0x80000000;
          auVar68._4_4_ = (uint)bVar34 * -0x80000000;
          auVar68._8_4_ = (uint)bVar35 * -0x80000000;
          auVar68._12_4_ = (uint)bVar36 * -0x80000000;
          uVar56 = movmskps((int)pRVar57,auVar68);
          pRVar57 = (RayHitK<4> *)CONCAT44((int)((ulong)pRVar57 >> 0x20),uVar56);
        }
        if ((uVar51 & 8) == 0) {
          if (pRVar57 == (RayHitK<4> *)0x0) {
            iVar46 = 4;
          }
          else {
            uVar47 = uVar51 & 0xfffffffffffffff0;
            lVar48 = 0;
            if (pRVar57 != (RayHitK<4> *)0x0) {
              for (; ((ulong)pRVar57 >> lVar48 & 1) == 0; lVar48 = lVar48 + 1) {
              }
            }
            iVar46 = 0;
            uVar51 = *(ulong *)(uVar47 + lVar48 * 8);
            uVar54 = (ulong)(pRVar57 + -1) & (ulong)pRVar57;
            if (uVar54 != 0) {
              uVar63 = tNear.field_0.i[lVar48];
              lVar48 = 0;
              if (uVar54 != 0) {
                for (; (uVar54 >> lVar48 & 1) == 0; lVar48 = lVar48 + 1) {
                }
              }
              uVar60 = *(ulong *)(uVar47 + lVar48 * 8);
              uVar64 = tNear.field_0.i[lVar48];
              uVar54 = uVar54 - 1 & uVar54;
              if (uVar54 == 0) {
                if (uVar63 < uVar64) {
                  (local_1308->ptr).ptr = uVar60;
                  local_1308->dist = uVar64;
                  local_1308 = local_1308 + 1;
                }
                else {
                  (local_1308->ptr).ptr = uVar51;
                  local_1308->dist = uVar63;
                  uVar51 = uVar60;
                  local_1308 = local_1308 + 1;
                }
              }
              else {
                auVar97._8_4_ = uVar63;
                auVar97._0_8_ = uVar51;
                auVar97._12_4_ = 0;
                auVar110._8_4_ = uVar64;
                auVar110._0_8_ = uVar60;
                auVar110._12_4_ = 0;
                lVar48 = 0;
                if (uVar54 != 0) {
                  for (; (uVar54 >> lVar48 & 1) == 0; lVar48 = lVar48 + 1) {
                  }
                }
                uVar28 = *(undefined8 *)(uVar47 + lVar48 * 8);
                iVar26 = tNear.field_0.i[lVar48];
                auVar105._8_4_ = iVar26;
                auVar105._0_8_ = uVar28;
                auVar105._12_4_ = 0;
                auVar69._8_4_ = -(uint)((int)uVar63 < (int)uVar64);
                uVar54 = uVar54 - 1 & uVar54;
                if (uVar54 == 0) {
                  auVar69._4_4_ = auVar69._8_4_;
                  auVar69._0_4_ = auVar69._8_4_;
                  auVar69._12_4_ = auVar69._8_4_;
                  auVar115._8_4_ = uVar64;
                  auVar115._0_8_ = uVar60;
                  auVar115._12_4_ = 0;
                  auVar116 = blendvps(auVar115,auVar97,auVar69);
                  auVar96 = blendvps(auVar97,auVar110,auVar69);
                  auVar70._8_4_ = -(uint)(auVar116._8_4_ < iVar26);
                  auVar70._4_4_ = auVar70._8_4_;
                  auVar70._0_4_ = auVar70._8_4_;
                  auVar70._12_4_ = auVar70._8_4_;
                  auVar111._8_4_ = iVar26;
                  auVar111._0_8_ = uVar28;
                  auVar111._12_4_ = 0;
                  auVar109 = blendvps(auVar111,auVar116,auVar70);
                  auVar116 = blendvps(auVar116,auVar105,auVar70);
                  auVar71._8_4_ = -(uint)(auVar96._8_4_ < auVar116._8_4_);
                  auVar71._4_4_ = auVar71._8_4_;
                  auVar71._0_4_ = auVar71._8_4_;
                  auVar71._12_4_ = auVar71._8_4_;
                  SVar106 = (StackItemT<embree::NodeRefPtr<4>_>)blendvps(auVar116,auVar96,auVar71);
                  SVar98 = (StackItemT<embree::NodeRefPtr<4>_>)blendvps(auVar96,auVar116,auVar71);
                  *local_1308 = SVar98;
                  local_1308[1] = SVar106;
                  uVar51 = auVar109._0_8_;
                  local_1308 = local_1308 + 2;
                }
                else {
                  lVar48 = 0;
                  if (uVar54 != 0) {
                    for (; (uVar54 >> lVar48 & 1) == 0; lVar48 = lVar48 + 1) {
                    }
                  }
                  auVar72._4_4_ = auVar69._8_4_;
                  auVar72._0_4_ = auVar69._8_4_;
                  auVar72._8_4_ = auVar69._8_4_;
                  auVar72._12_4_ = auVar69._8_4_;
                  auVar117 = blendvps(auVar110,auVar97,auVar72);
                  auVar96 = blendvps(auVar97,auVar110,auVar72);
                  auVar129._8_4_ = tNear.field_0.i[lVar48];
                  auVar129._0_8_ = *(undefined8 *)(uVar47 + lVar48 * 8);
                  auVar129._12_4_ = 0;
                  auVar73._8_4_ = -(uint)(iVar26 < tNear.field_0.i[lVar48]);
                  auVar73._4_4_ = auVar73._8_4_;
                  auVar73._0_4_ = auVar73._8_4_;
                  auVar73._12_4_ = auVar73._8_4_;
                  auVar116 = blendvps(auVar129,auVar105,auVar73);
                  auVar109 = blendvps(auVar105,auVar129,auVar73);
                  auVar74._8_4_ = -(uint)(auVar96._8_4_ < auVar109._8_4_);
                  auVar74._4_4_ = auVar74._8_4_;
                  auVar74._0_4_ = auVar74._8_4_;
                  auVar74._12_4_ = auVar74._8_4_;
                  auVar130 = blendvps(auVar109,auVar96,auVar74);
                  SVar98 = (StackItemT<embree::NodeRefPtr<4>_>)blendvps(auVar96,auVar109,auVar74);
                  auVar75._8_4_ = -(uint)(auVar117._8_4_ < auVar116._8_4_);
                  auVar75._4_4_ = auVar75._8_4_;
                  auVar75._0_4_ = auVar75._8_4_;
                  auVar75._12_4_ = auVar75._8_4_;
                  auVar96 = blendvps(auVar116,auVar117,auVar75);
                  auVar109 = blendvps(auVar117,auVar116,auVar75);
                  auVar76._8_4_ = -(uint)(auVar109._8_4_ < auVar130._8_4_);
                  auVar76._4_4_ = auVar76._8_4_;
                  auVar76._0_4_ = auVar76._8_4_;
                  auVar76._12_4_ = auVar76._8_4_;
                  SVar106 = (StackItemT<embree::NodeRefPtr<4>_>)blendvps(auVar130,auVar109,auVar76);
                  SVar118 = (StackItemT<embree::NodeRefPtr<4>_>)blendvps(auVar109,auVar130,auVar76);
                  *local_1308 = SVar98;
                  local_1308[1] = SVar118;
                  local_1308[2] = SVar106;
                  uVar51 = auVar96._0_8_;
                  local_1308 = local_1308 + 3;
                }
              }
            }
          }
        }
        else {
          iVar46 = 6;
        }
      } while (iVar46 == 0);
    } while (iVar46 != 6);
    local_1230 = (ulong)((uint)uVar51 & 0xf) - 8;
    if (local_1230 != 0) {
      uVar51 = uVar51 & 0xfffffffffffffff0;
      local_1220 = 0;
      do {
        lVar48 = local_1220 * 0x50;
        pSVar29 = context->scene;
        pGVar30 = (pSVar29->geometries).items[*(uint *)(uVar51 + 0x30 + lVar48)].ptr;
        fVar67 = (pGVar30->time_range).lower;
        fVar94 = (pGVar30->time_range).upper - fVar67;
        fVar126 = ((*(float *)(ray + k * 4 + 0x70) - fVar67) / fVar94) * pGVar30->fnumTimeSegments;
        auVar99 = roundss(ZEXT416((uint)fVar94),ZEXT416((uint)fVar126),9);
        fVar67 = pGVar30->fnumTimeSegments + -1.0;
        if (fVar67 <= auVar99._0_4_) {
          auVar99._0_4_ = fVar67;
        }
        fVar67 = 0.0;
        if (0.0 <= auVar99._0_4_) {
          fVar67 = auVar99._0_4_;
        }
        uVar54 = (ulong)*(uint *)(uVar51 + 4 + lVar48);
        lVar31 = *(long *)(*(long *)&pGVar30[2].numPrimitives + (long)(int)fVar67 * 0x38);
        lVar32 = *(long *)(*(long *)&pGVar30[2].numPrimitives + 0x38 + (long)(int)fVar67 * 0x38);
        pfVar10 = (float *)(lVar31 + (ulong)*(uint *)(uVar51 + lVar48) * 4);
        uVar61 = (ulong)*(uint *)(uVar51 + 0x10 + lVar48);
        pfVar11 = (float *)(lVar31 + uVar61 * 4);
        puVar12 = (undefined8 *)(lVar31 + (ulong)*(uint *)(uVar51 + 0x20 + lVar48) * 4);
        uVar28 = *puVar12;
        uVar41 = puVar12[1];
        pfVar13 = (float *)(lVar31 + uVar54 * 4);
        uVar55 = (ulong)*(uint *)(uVar51 + 0x14 + lVar48);
        pfVar14 = (float *)(lVar31 + uVar55 * 4);
        pfVar15 = (float *)(lVar31 + (ulong)*(uint *)(uVar51 + 0x24 + lVar48) * 4);
        uVar62 = (ulong)*(uint *)(uVar51 + 8 + lVar48);
        pfVar16 = (float *)(lVar31 + uVar62 * 4);
        uVar47 = (ulong)*(uint *)(uVar51 + 0x18 + lVar48);
        puVar17 = (undefined4 *)(lVar31 + uVar47 * 4);
        uVar49 = (ulong)*(uint *)(uVar51 + 0x28 + lVar48);
        pfVar18 = (float *)(lVar31 + uVar49 * 4);
        uVar60 = (ulong)*(uint *)(uVar51 + 0xc + lVar48);
        pfVar19 = (float *)(lVar31 + uVar60 * 4);
        uVar59 = (ulong)*(uint *)(uVar51 + 0x1c + lVar48);
        puVar20 = (undefined4 *)(lVar31 + uVar59 * 4);
        uVar58 = (ulong)*(uint *)(uVar51 + 0x2c + lVar48);
        pfVar21 = (float *)(lVar31 + uVar58 * 4);
        pfVar9 = (float *)(lVar32 + (ulong)*(uint *)(uVar51 + lVar48) * 4);
        pfVar22 = (float *)(lVar32 + uVar61 * 4);
        fVar126 = fVar126 - fVar67;
        pfVar23 = (float *)(lVar32 + uVar54 * 4);
        pfVar24 = (float *)(lVar32 + uVar62 * 4);
        local_12c8 = CONCAT44(puVar20[2],puVar17[2]);
        local_1288 = CONCAT44(*puVar20,*puVar17);
        local_12e8 = (float)uVar28;
        fStack_12e4 = (float)((ulong)uVar28 >> 0x20);
        fStack_12e0 = (float)uVar41;
        pfVar1 = (float *)(lVar32 + uVar60 * 4);
        pfVar2 = (float *)(lVar32 + uVar47 * 4);
        pfVar3 = (float *)(lVar32 + uVar55 * 4);
        pfVar4 = (float *)(lVar32 + uVar59 * 4);
        pfVar5 = (float *)(lVar32 + local_12c8 * 4);
        pfVar6 = (float *)(lVar32 + uVar49 * 4);
        pfVar7 = (float *)(lVar32 + local_1288 * 4);
        pfVar8 = (float *)(lVar32 + uVar58 * 4);
        fVar165 = 1.0 - fVar126;
        fStack_12dc = (float)((ulong)uVar41 >> 0x20);
        puVar12 = (undefined8 *)(uVar51 + 0x30 + lVar48);
        local_1018 = *puVar12;
        uStack_1010 = puVar12[1];
        puVar12 = (undefined8 *)(uVar51 + 0x40 + lVar48);
        local_11c8 = *puVar12;
        uStack_11c0 = puVar12[1];
        fVar67 = *(float *)(ray + k * 4);
        fVar94 = *(float *)(ray + k * 4 + 0x10);
        fVar171 = *(float *)(ray + k * 4 + 0x20);
        fVar127 = (*pfVar10 * fVar165 + *pfVar9 * fVar126) - fVar67;
        fVar131 = (*pfVar13 * fVar165 + *pfVar23 * fVar126) - fVar67;
        fVar133 = (*pfVar16 * fVar165 + *pfVar24 * fVar126) - fVar67;
        fVar134 = (*pfVar19 * fVar165 + *pfVar1 * fVar126) - fVar67;
        fVar156 = (pfVar10[1] * fVar165 + pfVar9[1] * fVar126) - fVar94;
        fVar159 = (pfVar13[1] * fVar165 + pfVar23[1] * fVar126) - fVar94;
        fVar161 = (pfVar16[1] * fVar165 + pfVar24[1] * fVar126) - fVar94;
        fVar163 = (pfVar19[1] * fVar165 + pfVar1[1] * fVar126) - fVar94;
        fVar112 = (pfVar10[2] * fVar165 + pfVar9[2] * fVar126) - fVar171;
        fVar121 = (pfVar13[2] * fVar165 + pfVar23[2] * fVar126) - fVar171;
        fStack_1270 = (fStack_1270 * fVar165 + pfVar24[2] * fVar126) - fVar171;
        fStack_126c = (fStack_126c * fVar165 + pfVar1[2] * fVar126) - fVar171;
        fVar135 = (*pfVar11 * fVar165 + *pfVar22 * fVar126) - fVar67;
        fVar138 = (*pfVar14 * fVar165 + *pfVar3 * fVar126) - fVar67;
        fVar139 = (fStack_1290 * fVar165 + *pfVar2 * fVar126) - fVar67;
        fVar140 = (fStack_128c * fVar165 + *pfVar4 * fVar126) - fVar67;
        fVar172 = (pfVar11[1] * fVar165 + pfVar22[1] * fVar126) - fVar94;
        fVar175 = (pfVar14[1] * fVar165 + pfVar3[1] * fVar126) - fVar94;
        fVar177 = ((float)puVar17[1] * fVar165 + pfVar2[1] * fVar126) - fVar94;
        fVar179 = ((float)puVar20[1] * fVar165 + pfVar4[1] * fVar126) - fVar94;
        fVar141 = (pfVar18[2] * fVar165 + pfVar22[2] * fVar126) - fVar171;
        fVar144 = (pfVar21[2] * fVar165 + pfVar3[2] * fVar126) - fVar171;
        fVar147 = (fStack_12d0 * fVar165 + pfVar2[2] * fVar126) - fVar171;
        fVar149 = (fStack_12cc * fVar165 + pfVar4[2] * fVar126) - fVar171;
        fVar142 = (local_12e8 * fVar165 + *pfVar5 * fVar126) - fVar67;
        fVar145 = (*pfVar15 * fVar165 + *pfVar7 * fVar126) - fVar67;
        fVar148 = (*pfVar18 * fVar165 + *pfVar6 * fVar126) - fVar67;
        fVar67 = (*pfVar21 * fVar165 + *pfVar8 * fVar126) - fVar67;
        fVar95 = (fStack_12e4 * fVar165 + pfVar5[1] * fVar126) - fVar94;
        fVar103 = (pfVar15[1] * fVar165 + pfVar7[1] * fVar126) - fVar94;
        fVar104 = (pfVar18[1] * fVar165 + pfVar6[1] * fVar126) - fVar94;
        fVar94 = (pfVar21[1] * fVar165 + pfVar8[1] * fVar126) - fVar94;
        fVar166 = (fVar165 * fStack_12e0 + fVar126 * pfVar5[2]) - fVar171;
        fVar169 = (fVar165 * pfVar15[2] + fVar126 * pfVar7[2]) - fVar171;
        fVar170 = (fVar165 * fStack_12e0 + fVar126 * pfVar6[2]) - fVar171;
        fVar171 = (fVar165 * fStack_12dc + fVar126 * pfVar8[2]) - fVar171;
        local_1038 = fVar142 - fVar127;
        fStack_1034 = fVar145 - fVar131;
        fStack_1030 = fVar148 - fVar133;
        fStack_102c = fVar67 - fVar134;
        local_1028 = fVar95 - fVar156;
        fStack_1024 = fVar103 - fVar159;
        fStack_1020 = fVar104 - fVar161;
        fStack_101c = fVar94 - fVar163;
        fVar143 = fVar166 - fVar112;
        fVar146 = fVar169 - fVar121;
        fStack_1290 = fVar170 - fStack_1270;
        fStack_128c = fVar171 - fStack_126c;
        fVar126 = *(float *)(ray + k * 4 + 0x50);
        fStack_12d0 = *(float *)(ray + k * 4 + 0x60);
        fVar165 = *(float *)(ray + k * 4 + 0x40);
        fVar128 = (local_1028 * (fVar166 + fVar112) - (fVar95 + fVar156) * fVar143) * fVar165 +
                  ((fVar142 + fVar127) * fVar143 - (fVar166 + fVar112) * local_1038) * fVar126 +
                  (local_1038 * (fVar95 + fVar156) - (fVar142 + fVar127) * local_1028) * fStack_12d0
        ;
        fVar132 = (fStack_1024 * (fVar169 + fVar121) - (fVar103 + fVar159) * fVar146) * fVar165 +
                  ((fVar145 + fVar131) * fVar146 - (fVar169 + fVar121) * fStack_1034) * fVar126 +
                  (fStack_1034 * (fVar103 + fVar159) - (fVar145 + fVar131) * fStack_1024) *
                  fStack_12d0;
        local_1078._0_8_ = CONCAT44(fVar132,fVar128);
        local_1078._8_4_ =
             (fStack_1020 * (fVar170 + fStack_1270) - (fVar104 + fVar161) * fStack_1290) * fVar165 +
             ((fVar148 + fVar133) * fStack_1290 - (fVar170 + fStack_1270) * fStack_1030) * fVar126 +
             (fStack_1030 * (fVar104 + fVar161) - (fVar148 + fVar133) * fStack_1020) * fStack_12d0;
        local_1078._12_4_ =
             (fStack_101c * (fVar171 + fStack_126c) - (fVar94 + fVar163) * fStack_128c) * fVar165 +
             ((fVar67 + fVar134) * fStack_128c - (fVar171 + fStack_126c) * fStack_102c) * fVar126 +
             (fStack_102c * (fVar94 + fVar163) - (fVar67 + fVar134) * fStack_101c) * fStack_12d0;
        fVar151 = fVar127 - fVar135;
        fVar153 = fVar131 - fVar138;
        fVar154 = fVar133 - fVar139;
        fVar155 = fVar134 - fVar140;
        fVar157 = fVar156 - fVar172;
        fVar160 = fVar159 - fVar175;
        fVar162 = fVar161 - fVar177;
        fVar164 = fVar163 - fVar179;
        local_1048 = fVar112 - fVar141;
        fStack_1044 = fVar121 - fVar144;
        fStack_1040 = fStack_1270 - fVar147;
        fStack_103c = fStack_126c - fVar149;
        local_1068._0_4_ =
             (fVar157 * (fVar112 + fVar141) - (fVar156 + fVar172) * local_1048) * fVar165 +
             ((fVar127 + fVar135) * local_1048 - (fVar112 + fVar141) * fVar151) * fVar126 +
             (fVar151 * (fVar156 + fVar172) - (fVar127 + fVar135) * fVar157) * fStack_12d0;
        local_1068._4_4_ =
             (fVar160 * (fVar121 + fVar144) - (fVar159 + fVar175) * fStack_1044) * fVar165 +
             ((fVar131 + fVar138) * fStack_1044 - (fVar121 + fVar144) * fVar153) * fVar126 +
             (fVar153 * (fVar159 + fVar175) - (fVar131 + fVar138) * fVar160) * fStack_12d0;
        local_1068._8_4_ =
             (fVar162 * (fStack_1270 + fVar147) - (fVar161 + fVar177) * fStack_1040) * fVar165 +
             ((fVar133 + fVar139) * fStack_1040 - (fStack_1270 + fVar147) * fVar154) * fVar126 +
             (fVar154 * (fVar161 + fVar177) - (fVar133 + fVar139) * fVar162) * fStack_12d0;
        local_1068._12_4_ =
             (fVar164 * (fStack_126c + fVar149) - (fVar163 + fVar179) * fStack_103c) * fVar165 +
             ((fVar134 + fVar140) * fStack_103c - (fStack_126c + fVar149) * fVar155) * fVar126 +
             (fVar155 * (fVar163 + fVar179) - (fVar134 + fVar140) * fVar164) * fStack_12d0;
        fVar173 = fVar135 - fVar142;
        fVar176 = fVar138 - fVar145;
        fVar178 = fVar139 - fVar148;
        fVar180 = fVar140 - fVar67;
        fVar113 = fVar172 - fVar95;
        fVar122 = fVar175 - fVar103;
        fVar123 = fVar177 - fVar104;
        fVar124 = fVar179 - fVar94;
        local_1058 = fVar141 - fVar166;
        fStack_1054 = fVar144 - fVar169;
        fStack_1050 = fVar147 - fVar170;
        fStack_104c = fVar149 - fVar171;
        auVar77._0_4_ =
             (fVar113 * (fVar166 + fVar141) - (fVar95 + fVar172) * local_1058) * fVar165 +
             ((fVar142 + fVar135) * local_1058 - (fVar166 + fVar141) * fVar173) * fVar126 +
             (fVar173 * (fVar95 + fVar172) - (fVar142 + fVar135) * fVar113) * fStack_12d0;
        auVar77._4_4_ =
             (fVar122 * (fVar169 + fVar144) - (fVar103 + fVar175) * fStack_1054) * fVar165 +
             ((fVar145 + fVar138) * fStack_1054 - (fVar169 + fVar144) * fVar176) * fVar126 +
             (fVar176 * (fVar103 + fVar175) - (fVar145 + fVar138) * fVar122) * fStack_12d0;
        auVar77._8_4_ =
             (fVar123 * (fVar170 + fVar147) - (fVar104 + fVar177) * fStack_1050) * fVar165 +
             ((fVar148 + fVar139) * fStack_1050 - (fVar170 + fVar147) * fVar178) * fVar126 +
             (fVar178 * (fVar104 + fVar177) - (fVar148 + fVar139) * fVar123) * fStack_12d0;
        auVar77._12_4_ =
             (fVar124 * (fVar171 + fVar149) - (fVar94 + fVar179) * fStack_104c) * fVar165 +
             ((fVar67 + fVar140) * fStack_104c - (fVar171 + fVar149) * fVar180) * fVar126 +
             (fVar180 * (fVar94 + fVar179) - (fVar67 + fVar140) * fVar124) * fStack_12d0;
        local_1088 = fVar128 + local_1068._0_4_ + auVar77._0_4_;
        fStack_1084 = fVar132 + local_1068._4_4_ + auVar77._4_4_;
        fStack_1080 = local_1078._8_4_ + local_1068._8_4_ + auVar77._8_4_;
        fStack_107c = local_1078._12_4_ + local_1068._12_4_ + auVar77._12_4_;
        auVar86._8_4_ = local_1078._8_4_;
        auVar86._0_8_ = local_1078._0_8_;
        auVar86._12_4_ = local_1078._12_4_;
        auVar87 = minps(auVar86,local_1068);
        auVar87 = minps(auVar87,auVar77);
        auVar167._8_4_ = local_1078._8_4_;
        auVar167._0_8_ = local_1078._0_8_;
        auVar167._12_4_ = local_1078._12_4_;
        auVar96 = maxps(auVar167,local_1068);
        auVar96 = maxps(auVar96,auVar77);
        fVar67 = ABS(local_1088) * 1.1920929e-07;
        fVar94 = ABS(fStack_1084) * 1.1920929e-07;
        fVar171 = ABS(fStack_1080) * 1.1920929e-07;
        fVar95 = ABS(fStack_107c) * 1.1920929e-07;
        auVar168._4_4_ = -(uint)(auVar96._4_4_ <= fVar94);
        auVar168._0_4_ = -(uint)(auVar96._0_4_ <= fVar67);
        auVar168._8_4_ = -(uint)(auVar96._8_4_ <= fVar171);
        auVar168._12_4_ = -(uint)(auVar96._12_4_ <= fVar95);
        auVar88._4_4_ = -(uint)(-fVar94 <= auVar87._4_4_);
        auVar88._0_4_ = -(uint)(-fVar67 <= auVar87._0_4_);
        auVar88._8_4_ = -(uint)(-fVar171 <= auVar87._8_4_);
        auVar88._12_4_ = -(uint)(-fVar95 <= auVar87._12_4_);
        auVar168 = auVar168 | auVar88;
        iVar46 = movmskps((int)&mapUV,auVar168);
        fStack_12cc = fStack_12d0;
        if (iVar46 != 0) {
          auVar137._0_4_ = local_1028 * local_1048 - fVar157 * fVar143;
          auVar137._4_4_ = fStack_1024 * fStack_1044 - fVar160 * fVar146;
          auVar137._8_4_ = fStack_1020 * fStack_1040 - fVar162 * fStack_1290;
          auVar137._12_4_ = fStack_101c * fStack_103c - fVar164 * fStack_128c;
          auVar150._0_4_ = fVar157 * local_1058 - fVar113 * local_1048;
          auVar150._4_4_ = fVar160 * fStack_1054 - fVar122 * fStack_1044;
          auVar150._8_4_ = fVar162 * fStack_1050 - fVar123 * fStack_1040;
          auVar150._12_4_ = fVar164 * fStack_104c - fVar124 * fStack_103c;
          auVar78._4_4_ = -(uint)(ABS(fVar160 * fVar146) < ABS(fVar122 * fStack_1044));
          auVar78._0_4_ = -(uint)(ABS(fVar157 * fVar143) < ABS(fVar113 * local_1048));
          auVar78._8_4_ = -(uint)(ABS(fVar162 * fStack_1290) < ABS(fVar123 * fStack_1040));
          auVar78._12_4_ = -(uint)(ABS(fVar164 * fStack_128c) < ABS(fVar124 * fStack_103c));
          local_1138 = blendvps(auVar150,auVar137,auVar78);
          auVar174._0_4_ = fVar173 * local_1048 - fVar151 * local_1058;
          auVar174._4_4_ = fVar176 * fStack_1044 - fVar153 * fStack_1054;
          auVar174._8_4_ = fVar178 * fStack_1040 - fVar154 * fStack_1050;
          auVar174._12_4_ = fVar180 * fStack_103c - fVar155 * fStack_104c;
          auVar79._4_4_ = -(uint)(ABS(fStack_1034 * fStack_1044) < ABS(fVar153 * fStack_1054));
          auVar79._0_4_ = -(uint)(ABS(local_1038 * local_1048) < ABS(fVar151 * local_1058));
          auVar79._8_4_ = -(uint)(ABS(fStack_1030 * fStack_1040) < ABS(fVar154 * fStack_1050));
          auVar79._12_4_ = -(uint)(ABS(fStack_102c * fStack_103c) < ABS(fVar155 * fStack_104c));
          auVar37._4_4_ = fVar146 * fVar153 - fStack_1034 * fStack_1044;
          auVar37._0_4_ = fVar143 * fVar151 - local_1038 * local_1048;
          auVar37._8_4_ = fStack_1290 * fVar154 - fStack_1030 * fStack_1040;
          auVar37._12_4_ = fStack_128c * fVar155 - fStack_102c * fStack_103c;
          local_1128 = blendvps(auVar174,auVar37,auVar79);
          auVar119._0_4_ = local_1038 * fVar157 - fVar151 * local_1028;
          auVar119._4_4_ = fStack_1034 * fVar160 - fVar153 * fStack_1024;
          auVar119._8_4_ = fStack_1030 * fVar162 - fVar154 * fStack_1020;
          auVar119._12_4_ = fStack_102c * fVar164 - fVar155 * fStack_101c;
          auVar152._0_4_ = fVar151 * fVar113 - fVar173 * fVar157;
          auVar152._4_4_ = fVar153 * fVar122 - fVar176 * fVar160;
          auVar152._8_4_ = fVar154 * fVar123 - fVar178 * fVar162;
          auVar152._12_4_ = fVar155 * fVar124 - fVar180 * fVar164;
          auVar80._4_4_ = -(uint)(ABS(fVar153 * fStack_1024) < ABS(fVar176 * fVar160));
          auVar80._0_4_ = -(uint)(ABS(fVar151 * local_1028) < ABS(fVar173 * fVar157));
          auVar80._8_4_ = -(uint)(ABS(fVar154 * fStack_1020) < ABS(fVar178 * fVar162));
          auVar80._12_4_ = -(uint)(ABS(fVar155 * fStack_101c) < ABS(fVar180 * fVar164));
          local_1118 = blendvps(auVar152,auVar119,auVar80);
          fVar113 = fVar165 * local_1138._0_4_ +
                    fVar126 * local_1128._0_4_ + fStack_12d0 * local_1118._0_4_;
          fVar122 = fVar165 * local_1138._4_4_ +
                    fVar126 * local_1128._4_4_ + fStack_12d0 * local_1118._4_4_;
          fVar123 = fVar165 * local_1138._8_4_ +
                    fVar126 * local_1128._8_4_ + fStack_12d0 * local_1118._8_4_;
          fVar124 = fVar165 * local_1138._12_4_ +
                    fVar126 * local_1128._12_4_ + fStack_12d0 * local_1118._12_4_;
          fVar113 = fVar113 + fVar113;
          fVar122 = fVar122 + fVar122;
          fVar123 = fVar123 + fVar123;
          fVar124 = fVar124 + fVar124;
          auVar81._0_4_ = fVar112 * local_1118._0_4_;
          auVar81._4_4_ = fVar121 * local_1118._4_4_;
          auVar81._8_4_ = fStack_1270 * local_1118._8_4_;
          auVar81._12_4_ = fStack_126c * local_1118._12_4_;
          fVar165 = fVar127 * local_1138._0_4_ + fVar156 * local_1128._0_4_ + auVar81._0_4_;
          fVar95 = fVar131 * local_1138._4_4_ + fVar159 * local_1128._4_4_ + auVar81._4_4_;
          fVar103 = fVar133 * local_1138._8_4_ + fVar161 * local_1128._8_4_ + auVar81._8_4_;
          fVar104 = fVar134 * local_1138._12_4_ + fVar163 * local_1128._12_4_ + auVar81._12_4_;
          auVar40._4_4_ = fVar122;
          auVar40._0_4_ = fVar113;
          auVar40._8_4_ = fVar123;
          auVar40._12_4_ = fVar124;
          auVar87 = rcpps(auVar81,auVar40);
          fVar67 = auVar87._0_4_;
          fVar94 = auVar87._4_4_;
          fVar126 = auVar87._8_4_;
          fVar171 = auVar87._12_4_;
          fVar165 = ((1.0 - fVar113 * fVar67) * fVar67 + fVar67) * (fVar165 + fVar165);
          fVar95 = ((1.0 - fVar122 * fVar94) * fVar94 + fVar94) * (fVar95 + fVar95);
          fVar126 = ((1.0 - fVar123 * fVar126) * fVar126 + fVar126) * (fVar103 + fVar103);
          fVar171 = ((1.0 - fVar124 * fVar171) * fVar171 + fVar171) * (fVar104 + fVar104);
          fVar67 = *(float *)(ray + k * 4 + 0x80);
          fVar94 = *(float *)(ray + k * 4 + 0x30);
          auVar89._4_4_ = -(uint)(fVar94 <= fVar95);
          auVar89._0_4_ = -(uint)(fVar94 <= fVar165);
          auVar89._8_4_ = -(uint)(fVar94 <= fVar126);
          auVar89._12_4_ = -(uint)(fVar94 <= fVar171);
          auVar82._0_4_ = -(uint)(fVar165 <= fVar67 && fVar94 <= fVar165) & auVar168._0_4_;
          auVar82._4_4_ = -(uint)(fVar95 <= fVar67 && fVar94 <= fVar95) & auVar168._4_4_;
          auVar82._8_4_ = -(uint)(fVar126 <= fVar67 && fVar94 <= fVar126) & auVar168._8_4_;
          auVar82._12_4_ = -(uint)(fVar171 <= fVar67 && fVar94 <= fVar171) & auVar168._12_4_;
          iVar46 = movmskps(iVar46,auVar82);
          if (iVar46 != 0) {
            valid.field_0.i[0] = auVar82._0_4_ & -(uint)(fVar113 != 0.0);
            valid.field_0.i[1] = auVar82._4_4_ & -(uint)(fVar122 != 0.0);
            valid.field_0.i[2] = auVar82._8_4_ & -(uint)(fVar123 != 0.0);
            valid.field_0.i[3] = auVar82._12_4_ & -(uint)(fVar124 != 0.0);
            iVar46 = movmskps(iVar46,(undefined1  [16])valid.field_0);
            if (iVar46 != 0) {
              tNear.field_0.v[2] = local_1078._8_4_;
              tNear.field_0._0_8_ = local_1078._0_8_;
              tNear.field_0.v[3] = local_1078._12_4_;
              auVar44._4_4_ = fStack_1084;
              auVar44._0_4_ = local_1088;
              auVar44._8_4_ = fStack_1080;
              auVar44._12_4_ = fStack_107c;
              local_1148[0] = fVar165;
              local_1148[1] = fVar95;
              local_1148[2] = fVar126;
              local_1148[3] = fVar171;
              auVar87 = rcpps(auVar89,auVar44);
              fVar67 = auVar87._0_4_;
              fVar94 = auVar87._4_4_;
              fVar103 = auVar87._8_4_;
              fVar104 = auVar87._12_4_;
              fVar67 = (float)(-(uint)(1e-18 <= ABS(local_1088)) &
                              (uint)(((float)DAT_01feca10 - local_1088 * fVar67) * fVar67 + fVar67))
              ;
              fVar94 = (float)(-(uint)(1e-18 <= ABS(fStack_1084)) &
                              (uint)((DAT_01feca10._4_4_ - fStack_1084 * fVar94) * fVar94 + fVar94))
              ;
              fVar103 = (float)(-(uint)(1e-18 <= ABS(fStack_1080)) &
                               (uint)((DAT_01feca10._8_4_ - fStack_1080 * fVar103) * fVar103 +
                                     fVar103));
              fVar104 = (float)(-(uint)(1e-18 <= ABS(fStack_107c)) &
                               (uint)((DAT_01feca10._12_4_ - fStack_107c * fVar104) * fVar104 +
                                     fVar104));
              auVar120._0_4_ = fVar128 * fVar67;
              auVar120._4_4_ = fVar132 * fVar94;
              auVar120._8_4_ = local_1078._8_4_ * fVar103;
              auVar120._12_4_ = local_1078._12_4_ * fVar104;
              local_1168 = minps(auVar120,_DAT_01feca10);
              auVar158._0_4_ = fVar67 * local_1068._0_4_;
              auVar158._4_4_ = fVar94 * local_1068._4_4_;
              auVar158._8_4_ = fVar103 * local_1068._8_4_;
              auVar158._12_4_ = fVar104 * local_1068._12_4_;
              local_1158 = minps(auVar158,_DAT_01feca10);
              auVar38._4_4_ = fVar95;
              auVar38._0_4_ = fVar165;
              auVar38._8_4_ = fVar126;
              auVar38._12_4_ = fVar171;
              auVar96 = blendvps(_DAT_01feb9f0,auVar38,(undefined1  [16])valid.field_0);
              auVar107._4_4_ = auVar96._0_4_;
              auVar107._0_4_ = auVar96._4_4_;
              auVar107._8_4_ = auVar96._12_4_;
              auVar107._12_4_ = auVar96._8_4_;
              auVar87 = minps(auVar107,auVar96);
              auVar90._0_8_ = auVar87._8_8_;
              auVar90._8_4_ = auVar87._0_4_;
              auVar90._12_4_ = auVar87._4_4_;
              auVar87 = minps(auVar90,auVar87);
              uVar63 = -(uint)(auVar87._0_4_ == auVar96._0_4_);
              uVar64 = -(uint)(auVar87._4_4_ == auVar96._4_4_);
              uVar65 = -(uint)(auVar87._8_4_ == auVar96._8_4_);
              uVar66 = -(uint)(auVar87._12_4_ == auVar96._12_4_);
              auVar102._4_4_ = uVar64;
              auVar102._0_4_ = uVar63;
              auVar100._0_4_ = uVar63 & valid.field_0.i[0];
              auVar100._4_4_ = uVar64 & valid.field_0.i[1];
              auVar100._8_4_ = uVar65 & valid.field_0.i[2];
              auVar100._12_4_ = uVar66 & valid.field_0.i[3];
              iVar46 = movmskps((int)&mapUV,auVar100);
              auVar101._8_4_ = 0xffffffff;
              auVar101._0_8_ = 0xffffffffffffffff;
              auVar101._12_4_ = 0xffffffff;
              if (iVar46 != 0) {
                auVar102._8_4_ = uVar65;
                auVar102._12_4_ = uVar66;
                auVar101 = auVar102;
              }
              auVar83._0_4_ = valid.field_0.i[0] & auVar101._0_4_;
              auVar83._4_4_ = valid.field_0.i[1] & auVar101._4_4_;
              auVar83._8_4_ = valid.field_0.i[2] & auVar101._8_4_;
              auVar83._12_4_ = valid.field_0.i[3] & auVar101._12_4_;
              uVar56 = movmskps(iVar46,auVar83);
              uVar49 = CONCAT44((int)((ulong)&mapUV >> 0x20),uVar56);
              lVar48 = 0;
              scene = pSVar29;
              if (uVar49 != 0) {
                for (; (uVar49 >> lVar48 & 1) == 0; lVar48 = lVar48 + 1) {
                }
              }
LAB_00279006:
              uVar63 = *(uint *)((long)&local_1018 + lVar48 * 4);
              pRVar50 = (RTCRayN *)(ulong)uVar63;
              pGVar30 = (pSVar29->geometries).items[(long)pRVar50].ptr;
              if ((pGVar30->mask & *(uint *)(ray + k * 4 + 0x90)) == 0) {
                valid.field_0.v[lVar48] = 0.0;
              }
              else {
                if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                   (pGVar30->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                  uVar56 = *(undefined4 *)(local_1168 + lVar48 * 4);
                  fVar67 = local_1148[lVar48 + -4];
                  *(float *)(ray + k * 4 + 0x80) = local_1148[lVar48];
                  *(undefined4 *)(ray + k * 4 + 0xc0) = *(undefined4 *)(local_1138 + lVar48 * 4);
                  *(undefined4 *)(ray + k * 4 + 0xd0) = *(undefined4 *)(local_1128 + lVar48 * 4);
                  *(undefined4 *)(ray + k * 4 + 0xe0) = *(undefined4 *)(local_1118 + lVar48 * 4);
                  *(undefined4 *)(ray + k * 4 + 0xf0) = uVar56;
                  *(float *)(ray + k * 4 + 0x100) = fVar67;
                  *(undefined4 *)(ray + k * 4 + 0x110) =
                       *(undefined4 *)((long)&local_11c8 + lVar48 * 4);
                  *(uint *)(ray + k * 4 + 0x120) = uVar63;
                  *(uint *)(ray + k * 4 + 0x130) = context->user->instID[0];
                  *(uint *)(ray + k * 4 + 0x140) = context->user->instPrimID[0];
                  goto LAB_0027945b;
                }
                local_fd8 = *(undefined4 *)(local_1168 + lVar48 * 4);
                local_fc8 = local_1148[lVar48 + -4];
                uVar56 = *(undefined4 *)(local_1138 + lVar48 * 4);
                uVar25 = *(undefined4 *)(local_1128 + lVar48 * 4);
                local_fa8._4_4_ = uVar63;
                local_fa8._0_4_ = uVar63;
                local_fa8._8_4_ = uVar63;
                local_fa8._12_4_ = uVar63;
                uVar27 = *(undefined4 *)((long)&local_11c8 + lVar48 * 4);
                local_fb8._4_4_ = uVar27;
                local_fb8._0_4_ = uVar27;
                local_fb8._8_4_ = uVar27;
                local_fb8._12_4_ = uVar27;
                local_ff8._4_4_ = uVar25;
                local_ff8._0_4_ = uVar25;
                local_ff8._8_4_ = uVar25;
                local_ff8._12_4_ = uVar25;
                local_fe8 = *(undefined4 *)(local_1118 + lVar48 * 4);
                local_1008[0] = (RTCHitN)(char)uVar56;
                local_1008[1] = (RTCHitN)(char)((uint)uVar56 >> 8);
                local_1008[2] = (RTCHitN)(char)((uint)uVar56 >> 0x10);
                local_1008[3] = (RTCHitN)(char)((uint)uVar56 >> 0x18);
                local_1008[4] = (RTCHitN)(char)uVar56;
                local_1008[5] = (RTCHitN)(char)((uint)uVar56 >> 8);
                local_1008[6] = (RTCHitN)(char)((uint)uVar56 >> 0x10);
                local_1008[7] = (RTCHitN)(char)((uint)uVar56 >> 0x18);
                local_1008[8] = (RTCHitN)(char)uVar56;
                local_1008[9] = (RTCHitN)(char)((uint)uVar56 >> 8);
                local_1008[10] = (RTCHitN)(char)((uint)uVar56 >> 0x10);
                local_1008[0xb] = (RTCHitN)(char)((uint)uVar56 >> 0x18);
                local_1008[0xc] = (RTCHitN)(char)uVar56;
                local_1008[0xd] = (RTCHitN)(char)((uint)uVar56 >> 8);
                local_1008[0xe] = (RTCHitN)(char)((uint)uVar56 >> 0x10);
                local_1008[0xf] = (RTCHitN)(char)((uint)uVar56 >> 0x18);
                uStack_fe4 = local_fe8;
                uStack_fe0 = local_fe8;
                uStack_fdc = local_fe8;
                uStack_fd4 = local_fd8;
                uStack_fd0 = local_fd8;
                uStack_fcc = local_fd8;
                fStack_fc4 = local_fc8;
                fStack_fc0 = local_fc8;
                fStack_fbc = local_fc8;
                local_f98 = context->user->instID[0];
                uStack_f94 = local_f98;
                uStack_f90 = local_f98;
                uStack_f8c = local_f98;
                local_f88 = context->user->instPrimID[0];
                uStack_f84 = local_f88;
                uStack_f80 = local_f88;
                uStack_f7c = local_f88;
                uVar56 = *(undefined4 *)(ray + k * 4 + 0x80);
                *(float *)(ray + k * 4 + 0x80) = local_1148[lVar48];
                uStack_1260 = local_1258[1];
                local_1268 = (int)*local_1258;
                iStack_1264 = (int)((ulong)*local_1258 >> 0x20);
                args.valid = &local_1268;
                args.geometryUserPtr = pGVar30->userPtr;
                args.context = context->user;
                args.hit = local_1008;
                args.N = 4;
                pRVar50 = (RTCRayN *)pGVar30->intersectionFilterN;
                args.ray = (RTCRayN *)ray;
                if (pRVar50 != (RTCRayN *)0x0) {
                  pRVar50 = (RTCRayN *)(*(code *)pRVar50)(&args);
                }
                auVar42._4_4_ = iStack_1264;
                auVar42._0_4_ = local_1268;
                auVar42._8_8_ = uStack_1260;
                if (auVar42 == (undefined1  [16])0x0) {
                  auVar91._8_4_ = 0xffffffff;
                  auVar91._0_8_ = 0xffffffffffffffff;
                  auVar91._12_4_ = 0xffffffff;
                  auVar91 = auVar91 ^ _DAT_01febe20;
                }
                else {
                  pRVar50 = (RTCRayN *)context->args->filter;
                  if ((pRVar50 != (RTCRayN *)0x0) &&
                     (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                       RTC_RAY_QUERY_FLAG_INCOHERENT || (((pGVar30->field_8).field_0x2 & 0x40) != 0)
                      ))) {
                    pRVar50 = (RTCRayN *)(*(code *)pRVar50)(&args);
                  }
                  auVar43._4_4_ = iStack_1264;
                  auVar43._0_4_ = local_1268;
                  auVar43._8_8_ = uStack_1260;
                  auVar84._0_4_ = -(uint)(local_1268 == 0);
                  auVar84._4_4_ = -(uint)(iStack_1264 == 0);
                  auVar84._8_4_ = -(uint)((int)uStack_1260 == 0);
                  auVar84._12_4_ = -(uint)((int)((ulong)uStack_1260 >> 0x20) == 0);
                  auVar91 = auVar84 ^ _DAT_01febe20;
                  if (auVar43 != (undefined1  [16])0x0) {
                    auVar87 = blendvps(*(undefined1 (*) [16])args.hit,
                                       *(undefined1 (*) [16])(args.ray + 0xc0),auVar84);
                    *(undefined1 (*) [16])(args.ray + 0xc0) = auVar87;
                    auVar87 = blendvps(*(undefined1 (*) [16])(args.hit + 0x10),
                                       *(undefined1 (*) [16])(args.ray + 0xd0),auVar84);
                    *(undefined1 (*) [16])(args.ray + 0xd0) = auVar87;
                    auVar87 = blendvps(*(undefined1 (*) [16])(args.hit + 0x20),
                                       *(undefined1 (*) [16])(args.ray + 0xe0),auVar84);
                    *(undefined1 (*) [16])(args.ray + 0xe0) = auVar87;
                    auVar87 = blendvps(*(undefined1 (*) [16])(args.hit + 0x30),
                                       *(undefined1 (*) [16])(args.ray + 0xf0),auVar84);
                    *(undefined1 (*) [16])(args.ray + 0xf0) = auVar87;
                    auVar87 = blendvps(*(undefined1 (*) [16])(args.hit + 0x40),
                                       *(undefined1 (*) [16])(args.ray + 0x100),auVar84);
                    *(undefined1 (*) [16])(args.ray + 0x100) = auVar87;
                    auVar87 = blendvps(*(undefined1 (*) [16])(args.hit + 0x50),
                                       *(undefined1 (*) [16])(args.ray + 0x110),auVar84);
                    *(undefined1 (*) [16])(args.ray + 0x110) = auVar87;
                    auVar87 = blendvps(*(undefined1 (*) [16])(args.hit + 0x60),
                                       *(undefined1 (*) [16])(args.ray + 0x120),auVar84);
                    *(undefined1 (*) [16])(args.ray + 0x120) = auVar87;
                    auVar87 = blendvps(*(undefined1 (*) [16])(args.hit + 0x70),
                                       *(undefined1 (*) [16])(args.ray + 0x130),auVar84);
                    *(undefined1 (*) [16])(args.ray + 0x130) = auVar87;
                    auVar87 = blendvps(*(undefined1 (*) [16])(args.hit + 0x80),
                                       *(undefined1 (*) [16])(args.ray + 0x140),auVar84);
                    *(undefined1 (*) [16])(args.ray + 0x140) = auVar87;
                    pRVar50 = args.ray;
                  }
                }
                if ((_DAT_01fecb20 & auVar91) == (undefined1  [16])0x0) {
                  *(undefined4 *)(ray + k * 4 + 0x80) = uVar56;
                }
                valid.field_0.v[lVar48] = 0.0;
                fVar67 = *(float *)(ray + k * 4 + 0x80);
                valid.field_0.i[1] = -(uint)(fVar95 <= fVar67) & valid.field_0.i[1];
                valid.field_0.i[0] = -(uint)(fVar165 <= fVar67) & valid.field_0.i[0];
                valid.field_0.i[2] = -(uint)(fVar126 <= fVar67) & valid.field_0.i[2];
                valid.field_0.i[3] = -(uint)(fVar171 <= fVar67) & valid.field_0.i[3];
                fStack_12d0 = fVar126;
                fStack_12cc = fVar171;
              }
              iVar46 = movmskps((int)pRVar50,(undefined1  [16])valid.field_0);
              if (iVar46 == 0) goto LAB_0027945b;
              auVar39._4_4_ = fVar95;
              auVar39._0_4_ = fVar165;
              auVar39._8_4_ = fVar126;
              auVar39._12_4_ = fVar171;
              auVar96 = blendvps(_DAT_01feb9f0,auVar39,(undefined1  [16])valid.field_0);
              auVar108._4_4_ = auVar96._0_4_;
              auVar108._0_4_ = auVar96._4_4_;
              auVar108._8_4_ = auVar96._12_4_;
              auVar108._12_4_ = auVar96._8_4_;
              auVar87 = minps(auVar108,auVar96);
              auVar92._0_8_ = auVar87._8_8_;
              auVar92._8_4_ = auVar87._0_4_;
              auVar92._12_4_ = auVar87._4_4_;
              auVar87 = minps(auVar92,auVar87);
              auVar93._0_8_ =
                   CONCAT44(-(uint)(auVar87._4_4_ == auVar96._4_4_) & valid.field_0._4_4_,
                            -(uint)(auVar87._0_4_ == auVar96._0_4_) & valid.field_0._0_4_);
              auVar93._8_4_ = -(uint)(auVar87._8_4_ == auVar96._8_4_) & valid.field_0._8_4_;
              auVar93._12_4_ = -(uint)(auVar87._12_4_ == auVar96._12_4_) & valid.field_0._12_4_;
              iVar46 = movmskps(iVar46,auVar93);
              aVar85 = valid.field_0;
              if (iVar46 != 0) {
                aVar85.i[2] = auVar93._8_4_;
                aVar85._0_8_ = auVar93._0_8_;
                aVar85.i[3] = auVar93._12_4_;
              }
              uVar56 = movmskps(iVar46,(undefined1  [16])aVar85);
              uVar49 = CONCAT44((int)((ulong)pRVar50 >> 0x20),uVar56);
              lVar48 = 0;
              if (uVar49 != 0) {
                for (; (uVar49 >> lVar48 & 1) == 0; lVar48 = lVar48 + 1) {
                }
              }
              goto LAB_00279006;
            }
          }
        }
LAB_0027945b:
        local_1220 = local_1220 + 1;
      } while (local_1220 != local_1230);
    }
    uVar56 = *(undefined4 *)(ray + k * 4 + 0x80);
    auVar87._4_4_ = uVar56;
    auVar87._0_4_ = uVar56;
    auVar87._8_4_ = uVar56;
    auVar87._12_4_ = uVar56;
    uVar49 = local_1250;
    uVar55 = local_1238;
    uVar58 = local_1240;
    uVar59 = local_1248;
    fVar67 = local_1098;
    fVar94 = fStack_1094;
    fVar126 = fStack_1090;
    fVar171 = fStack_108c;
    fVar165 = local_10a8;
    fVar95 = fStack_10a4;
    fVar103 = fStack_10a0;
    fVar104 = fStack_109c;
    fVar112 = local_10d8;
    fVar113 = fStack_10d4;
    fVar121 = fStack_10d0;
    fVar122 = fStack_10cc;
    fVar123 = local_10b8;
    fVar124 = fStack_10b4;
    fVar127 = fStack_10b0;
    fVar128 = fStack_10ac;
    fVar131 = local_10c8;
    fVar132 = fStack_10c4;
    fVar133 = fStack_10c0;
    fVar134 = fStack_10bc;
    fVar135 = local_10e8;
    fVar138 = fStack_10e4;
    fVar139 = fStack_10e0;
    fVar140 = fStack_10dc;
    fVar141 = local_10f8;
    fVar142 = fStack_10f4;
    fVar143 = fStack_10f0;
    fVar144 = fStack_10ec;
    fVar145 = local_1108;
    fVar146 = fStack_1104;
    fVar147 = fStack_1100;
    fVar148 = fStack_10fc;
  } while( true );
}

Assistant:

void BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::intersect1(Accel::Intersectors* This,
                                                                                                const BVH* bvh,
                                                                                                NodeRef root,
                                                                                                size_t k,
                                                                                                Precalculations& pre,
                                                                                                RayHitK<K>& ray,
                                                                                                const TravRayK<K, robust>& tray,
                                                                                                RayQueryContext* context)
    {
      /* stack state */
      StackItemT<NodeRef> stack[stackSizeSingle];  // stack of nodes
      StackItemT<NodeRef>* stackPtr = stack + 1;   // current stack pointer
      StackItemT<NodeRef>* stackEnd = stack + stackSizeSingle;
      stack[0].ptr = root;
      stack[0].dist = neg_inf;

      /* load the ray into SIMD registers */
      TravRay<N,robust> tray1;
      tray1.template init<K>(k, tray.org, tray.dir, tray.rdir, tray.nearXYZ, tray.tnear[k], tray.tfar[k]);

      /* pop loop */
      while (true) pop:
      {
        /* pop next node */
        if (unlikely(stackPtr == stack)) break;
        stackPtr--;
        NodeRef cur = NodeRef(stackPtr->ptr);

        /* if popped node is too far, pop next one */
        if (unlikely(*(float*)&stackPtr->dist > ray.tfar[k]))
          continue;

        /* downtraversal loop */
        while (true)
        {
          /* intersect node */
          size_t mask; vfloat<N> tNear;
          STAT3(normal.trav_nodes, 1, 1, 1);
          bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray1, ray.time()[k], tNear, mask);
          if (unlikely(!nodeIntersected)) { STAT3(normal.trav_nodes,-1,-1,-1); break; }

          /* if no child is hit, pop next node */
          if (unlikely(mask == 0))
            goto pop;

          /* select next child and push other children */
          BVHNNodeTraverser1Hit<N, types>::traverseClosestHit(cur, mask, tNear, stackPtr, stackEnd);
        }

        /* this is a leaf node */
        assert(cur != BVH::emptyNode);
        STAT3(normal.trav_leaves, 1, 1, 1);
        size_t num; Primitive* prim = (Primitive*)cur.leaf(num);

        size_t lazy_node = 0;
        PrimitiveIntersectorK::intersect(This, pre, ray, k, context, prim, num, tray1, lazy_node);

        tray1.tfar = ray.tfar[k];

        if (unlikely(lazy_node)) {
          stackPtr->ptr = lazy_node;
          stackPtr->dist = neg_inf;
          stackPtr++;
        }
      }
    }